

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

bool __thiscall BCLog::Logger::WillLogCategoryLevel(Logger *this,LogFlags category,Level level)

{
  int iVar1;
  Level LVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  bool bVar5;
  long in_FS_OFFSET;
  LogFlags local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = true;
  local_28 = category;
  if ((int)level < 2) {
    if (((this->m_categories).super___atomic_base<unsigned_long>._M_i & category) == NONE) {
      bVar5 = false;
    }
    else {
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
      if (iVar1 != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar4 = std::__throw_system_error(iVar1);
          pthread_mutex_unlock((pthread_mutex_t *)this);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            _Unwind_Resume(uVar4);
          }
        }
        goto LAB_00404a42;
      }
      cVar3 = std::
              _Hashtable<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_BCLog::Level>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->m_category_log_levels)._M_h,&local_28);
      if (cVar3.super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_BCLog::Level>,_false>.
          _M_cur == (__node_type *)0x0) {
        LVar2 = (this->m_log_level)._M_i;
      }
      else {
        LVar2 = *(Level *)((long)cVar3.
                                 super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_BCLog::Level>,_false>
                                 ._M_cur + 0x10);
      }
      bVar5 = (int)LVar2 <= (int)level;
      pthread_mutex_unlock((pthread_mutex_t *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar5;
  }
LAB_00404a42:
  __stack_chk_fail();
}

Assistant:

bool BCLog::Logger::WillLogCategoryLevel(BCLog::LogFlags category, BCLog::Level level) const
{
    // Log messages at Info, Warning and Error level unconditionally, so that
    // important troubleshooting information doesn't get lost.
    if (level >= BCLog::Level::Info) return true;

    if (!WillLogCategory(category)) return false;

    StdLockGuard scoped_lock(m_cs);
    const auto it{m_category_log_levels.find(category)};
    return level >= (it == m_category_log_levels.end() ? LogLevel() : it->second);
}